

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::free_all_blocks(jpeg_decoder *this)

{
  mem_block *pmVar1;
  mem_block *n;
  mem_block *b;
  jpeg_decoder *this_local;
  
  this->m_pStream = (jpeg_decoder_stream *)0x0;
  n = this->m_pMem_blocks;
  while (n != (mem_block *)0x0) {
    pmVar1 = n->m_pNext;
    jpgd_free(n);
    n = pmVar1;
  }
  this->m_pMem_blocks = (mem_block *)0x0;
  return;
}

Assistant:

void jpeg_decoder::free_all_blocks()
	{
		m_pStream = nullptr;
		for (mem_block* b = m_pMem_blocks; b; )
		{
			mem_block* n = b->m_pNext;
			jpgd_free(b);
			b = n;
		}
		m_pMem_blocks = nullptr;
	}